

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

void __thiscall ON_SN_BLOCK::CullBlockHelper(ON_SN_BLOCK *this)

{
  uint local_18;
  uint local_14;
  ON__UINT32 j;
  ON__UINT32 i;
  ON_SN_BLOCK *this_local;
  
  local_14 = 0;
  while( true ) {
    if (this->m_count <= local_14) {
      return;
    }
    local_18 = local_14;
    if (this->m_sn[local_14].m_sn_active == '\0') break;
    local_14 = local_14 + 1;
  }
  while (local_18 = local_18 + 1, local_18 < this->m_count) {
    if (this->m_sn[local_18].m_sn_active != '\0') {
      memcpy(this->m_sn + local_14,this->m_sn + local_18,0x38);
      local_14 = local_14 + 1;
    }
  }
  if (local_14 == 0) {
    EmptyBlock(this);
    return;
  }
  this->m_count = local_14;
  this->m_purged = 0;
  if (this->m_sorted == 0) {
    return;
  }
  this->m_sn0 = this->m_sn[0].m_sn;
  this->m_sn1 = this->m_sn[this->m_count - 1].m_sn;
  return;
}

Assistant:

void ON_SN_BLOCK::CullBlockHelper()
{
  // Search the m_an[] array for elements whose m_u_type
  // value is zero and remove them from the array.
  //
  // This is a high speed helper function.  
  // The calling function must verify m_purged > 0.
  //
  // This function removes all m_sn[] elements
  // that have 0 == m_sn_active.

  ON__UINT32 i, j;
  for (i = 0; i < m_count; i++ )
  {
    if ( 0 == m_sn[i].m_sn_active )
    {
      for ( j = i+1; j < m_count; j++ )
      {
        if ( m_sn[j].m_sn_active )
        {
          m_sn[i++] = m_sn[j];
        }
      }
      if ( 0 == i )
      {
        EmptyBlock();
      }
      else
      {
        m_count = i;
        m_purged = 0;
        if ( m_sorted )
        {
          m_sn0 = m_sn[0].m_sn;
          m_sn1 = m_sn[m_count-1].m_sn;
        }
      }
      break;
    }
  }
}